

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O1

void __thiscall OpenMD::AtomType::copyAllData(AtomType *this,AtomType *orig)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict1 mVar2;
  pointer pcVar3;
  mapped_type_conflict1 *pmVar4;
  _Base_ptr p_Var5;
  mapped_type_conflict *pmVar6;
  pointer psVar7;
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  oprops;
  shared_ptr<OpenMD::GenericData> local_68;
  mapped_type_conflict local_58;
  undefined1 local_50 [32];
  
  this->hasBase_ = orig->hasBase_;
  this->base_ = orig->base_;
  this->mass_ = orig->mass_;
  pcVar3 = (orig->name_)._M_dataplus._M_p;
  local_50._0_8_ = (pointer)(local_50 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + (orig->name_)._M_string_length);
  std::__cxx11::string::operator=((string *)&this->name_,(string *)local_50);
  if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_,
                    (ulong)((long)&((__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *
                                    )local_50._16_8_)->_M_ptr + 1));
  }
  this->ident_ = orig->ident_;
  p_Var5 = (orig->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(orig->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator[](&orig->myResponsibilities_,(key_type *)(p_Var5 + 1));
      mVar2 = *pmVar4;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator[](&this->myResponsibilities_,(key_type *)(p_Var5 + 1));
      *pmVar4 = mVar2;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  p_Var5 = (orig->myValues_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(orig->myValues_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&orig->myValues_,(key_type *)(p_Var5 + 1));
      local_58 = *pmVar6;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&this->myValues_,(key_type *)(p_Var5 + 1));
      *pmVar6 = local_58;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  PropertyMap::getProperties
            ((vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
              *)local_50,&orig->properties_);
  if (local_50._0_8_ != local_50._8_8_) {
    psVar7 = (pointer)local_50._0_8_;
    do {
      local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar7->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (psVar7->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      addProperty(this,&local_68);
      if (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != (pointer)local_50._8_8_);
  }
  std::
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  ::~vector((vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
             *)local_50);
  return;
}

Assistant:

void AtomType::copyAllData(AtomType* orig) {
    // makes an exact replica of another atom type down to the
    // atom ID and any base attachments it may have.
    // use with caution!

    hasBase_ = orig->hasBase_;
    base_    = orig->base_;
    mass_    = orig->mass_;
    name_    = string(orig->name_);
    ident_   = orig->ident_;

    map<string, bool>::iterator i;
    ;
    map<string, RealType>::iterator j;

    for (i = orig->myResponsibilities_.begin();
         i != orig->myResponsibilities_.end(); ++i) {
      myResponsibilities_[(*i).first] = orig->myResponsibilities_[(*i).first];
    }

    for (j = orig->myValues_.begin(); j != orig->myValues_.end(); ++j) {
      myValues_[(*j).first] = orig->myValues_[(*j).first];
    }

    std::vector<std::shared_ptr<GenericData>> oprops = orig->getProperties();
    std::vector<std::shared_ptr<GenericData>>::iterator it;

    for (it = oprops.begin(); it != oprops.end(); ++it) {
      addProperty(*it);
    }
  }